

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply_test.cc
# Opt level: O1

void intgemm::kernel_multiply_test<(intgemm::CPUType)3,signed_char>(void)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 *puVar5;
  char cVar6;
  char cVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 in_ZMM12 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  AlignedVector<signed_char> output;
  AlignedVector<signed_char> input2;
  AlignedVector<signed_char> input1;
  AssertionHandler catchAssertionHandler;
  char local_f9;
  AlignedVector<signed_char> local_f8;
  AlignedVector<signed_char> local_e8;
  AlignedVector<signed_char> local_d8;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  undefined1 *local_a8;
  char *local_a0;
  size_t sStack_98;
  char *local_90;
  StringRef local_88;
  AssertionHandler local_78;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  
  auVar37 = in_ZMM12._0_32_;
  auVar34 = in_ZMM10._0_16_;
  if (2 < kCPU) {
    AlignedVector<signed_char>::AlignedVector(&local_d8,0x20,0x40);
    AlignedVector<signed_char>::AlignedVector(&local_e8,0x20,0x40);
    AlignedVector<signed_char>::AlignedVector(&local_f8,0x20,0x40);
    if (local_d8.size_ != 0) {
      lVar8 = local_d8.size_ - 1;
      auVar10._8_8_ = lVar8;
      auVar10._0_8_ = lVar8;
      auVar12._16_8_ = lVar8;
      auVar12._0_16_ = auVar10;
      auVar12._24_8_ = lVar8;
      uVar9 = 0;
      auVar14 = vpmovsxbq_avx2(ZEXT416(0x17161514));
      auVar31 = vpmovsxbq_avx2(ZEXT416(0x13121110));
      auVar1 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
      auVar2 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar32._8_8_ = 0x8000000000000000;
      auVar32._0_8_ = 0x8000000000000000;
      auVar34 = vpcmpeqd_avx(auVar34,auVar34);
      auVar35._8_8_ = 0x8000000000000000;
      auVar35._0_8_ = 0x8000000000000000;
      auVar35._16_8_ = 0x8000000000000000;
      auVar35._24_8_ = 0x8000000000000000;
      auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
      do {
        auVar38._8_8_ = uVar9;
        auVar38._0_8_ = uVar9;
        auVar38._16_8_ = uVar9;
        auVar38._24_8_ = uVar9;
        auVar13 = vpor_avx2(auVar38,auVar4);
        auVar15 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        cVar7 = (char)uVar9;
        if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9] = cVar7 + -0x10;
        }
        auVar15 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 1] = cVar7 + -0xf;
        }
        auVar39 = auVar35 ^ auVar12;
        auVar13 = vpcmpgtq_avx2(auVar13 ^ auVar35,auVar39);
        auVar36 = vpshuflw_avx2(auVar13,0xe8);
        auVar15._0_4_ = auVar36._16_4_;
        auVar15._4_4_ = auVar15._0_4_;
        auVar15._8_4_ = auVar15._0_4_;
        auVar15._12_4_ = auVar15._0_4_;
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 2] = cVar7 + -0xe;
        }
        auVar15 = vpackssdw_avx(auVar13._16_16_,auVar13._16_16_);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 3] = cVar7 + -0xd;
        }
        auVar36 = vpor_avx2(auVar38,auVar3);
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar13,auVar12);
        auVar16._0_2_ = auVar13._16_2_;
        auVar16._2_2_ = auVar16._0_2_;
        auVar16._4_2_ = auVar16._0_2_;
        auVar16._6_2_ = auVar16._0_2_;
        auVar16._8_2_ = auVar16._0_2_;
        auVar16._10_2_ = auVar16._0_2_;
        auVar16._12_2_ = auVar16._0_2_;
        auVar16._14_2_ = auVar16._0_2_;
        auVar15 = vpacksswb_avx(auVar16,auVar16);
        if ((auVar15 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 4] = cVar7 + -0xc;
        }
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpshufhw_avx(auVar15,0x84);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar13,auVar12);
        auVar17._0_4_ = auVar13._16_4_;
        auVar17._4_4_ = auVar17._0_4_;
        auVar17._8_4_ = auVar17._0_4_;
        auVar17._12_4_ = auVar17._0_4_;
        auVar15 = vpacksswb_avx(auVar17,auVar17);
        if ((auVar15 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 5] = cVar7 + -0xb;
        }
        auVar36 = vpcmpgtq_avx2(auVar36 ^ auVar35,auVar39);
        auVar13 = vpackssdw_avx2(auVar12,auVar36);
        auVar15 = auVar34 ^ auVar13._16_16_;
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 6] = cVar7 + -10;
        }
        auVar13 = vpshufhw_avx2(auVar36,0x84);
        auVar15 = auVar34 ^ auVar13._16_16_;
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 7] = cVar7 + -9;
        }
        auVar36 = vpor_avx2(auVar38,auVar2);
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar13 = vpmovzxwd_avx2(auVar15);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_d8.mem_[uVar9 + 8] = cVar7 + -8;
        }
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar15),0x55);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 9] = cVar7 + -7;
        }
        auVar36 = vpcmpgtq_avx2(auVar36 ^ auVar35,auVar39);
        auVar13 = vpshuflw_avx2(auVar36,0xe8);
        auVar18._0_4_ = auVar13._16_4_;
        auVar18._4_4_ = auVar18._0_4_;
        auVar18._8_4_ = auVar18._0_4_;
        auVar18._12_4_ = auVar18._0_4_;
        auVar15 = vpackssdw_avx(auVar34 ^ auVar18,auVar34 ^ auVar18);
        auVar13 = vpermq_avx2(ZEXT1632(auVar15),0x55);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 10] = cVar7 + -6;
        }
        auVar15 = vpackssdw_avx(auVar36._16_16_,auVar36._16_16_);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar15),0x55);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0xb] = cVar7 + -5;
        }
        auVar36 = vpor_avx2(auVar38,auVar1);
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar12,auVar13);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0xc] = cVar7 + -4;
        }
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpshufhw_avx(auVar15,0x84);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar12,auVar13);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0xd] = cVar7 + -3;
        }
        auVar36 = vpcmpgtq_avx2(auVar36 ^ auVar35,auVar39);
        auVar13 = vpackssdw_avx2(auVar12,auVar36);
        auVar13 = vpackssdw_avx2(auVar12,auVar37 ^ auVar13);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0xe] = cVar7 + -2;
        }
        auVar13 = vpshufhw_avx2(auVar36,0x84);
        auVar13 = vpackssdw_avx2(auVar12,auVar37 ^ auVar13);
        auVar13 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar13._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0xf] = cVar7 + -1;
        }
        auVar13 = vpor_avx2(auVar38,auVar31);
        auVar15 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x10] = cVar7;
        }
        auVar15 = vpcmpgtq_avx(auVar13._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x11] = cVar7 + '\x01';
        }
        auVar13 = vpcmpgtq_avx2(auVar13 ^ auVar35,auVar39);
        auVar36 = vpshuflw_avx2(auVar13,0xe8);
        auVar19._0_4_ = auVar36._16_4_;
        auVar19._4_4_ = auVar19._0_4_;
        auVar19._8_4_ = auVar19._0_4_;
        auVar19._12_4_ = auVar19._0_4_;
        auVar15 = vpackssdw_avx(auVar34 ^ auVar19,auVar34 ^ auVar19);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x12] = cVar7 + '\x02';
        }
        auVar15 = vpackssdw_avx(auVar13._16_16_,auVar13._16_16_);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x13] = cVar7 + '\x03';
        }
        auVar36 = vpor_avx2(auVar38,auVar14);
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar13,auVar12);
        auVar20._0_2_ = auVar13._16_2_;
        auVar20._2_2_ = auVar20._0_2_;
        auVar20._4_2_ = auVar20._0_2_;
        auVar20._6_2_ = auVar20._0_2_;
        auVar20._8_2_ = auVar20._0_2_;
        auVar20._10_2_ = auVar20._0_2_;
        auVar20._12_2_ = auVar20._0_2_;
        auVar20._14_2_ = auVar20._0_2_;
        auVar15 = vpacksswb_avx(auVar20,auVar20);
        if ((auVar15 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x14] = cVar7 + '\x04';
        }
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpshufhw_avx(auVar15,0x84);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar13,auVar12);
        auVar21._0_4_ = auVar13._16_4_;
        auVar21._4_4_ = auVar21._0_4_;
        auVar21._8_4_ = auVar21._0_4_;
        auVar21._12_4_ = auVar21._0_4_;
        auVar15 = vpacksswb_avx(auVar21,auVar21);
        if ((auVar15 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x15] = cVar7 + '\x05';
        }
        auVar36 = vpcmpgtq_avx2(auVar36 ^ auVar35,auVar39);
        auVar13 = vpackssdw_avx2(auVar12,auVar36);
        auVar15 = auVar34 ^ auVar13._16_16_;
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x16] = cVar7 + '\x06';
        }
        auVar13 = vpshufhw_avx2(auVar36,0x84);
        auVar15 = auVar34 ^ auVar13._16_16_;
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpacksswb_avx(auVar15,auVar15);
        if ((auVar15 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x17] = cVar7 + '\a';
        }
        auVar36 = vpor_avx2(auVar38,_DAT_001b8f40);
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar13 = vpmovzxwd_avx2(auVar15);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_d8.mem_[uVar9 + 0x18] = cVar7 + '\b';
        }
        auVar15 = vpcmpgtq_avx(auVar36._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar15),0x55);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x19] = cVar7 + '\t';
        }
        auVar36 = vpcmpgtq_avx2(auVar36 ^ auVar35,auVar39);
        auVar13 = vpshuflw_avx2(auVar36,0xe8);
        auVar22._0_4_ = auVar13._16_4_;
        auVar22._4_4_ = auVar22._0_4_;
        auVar22._8_4_ = auVar22._0_4_;
        auVar22._12_4_ = auVar22._0_4_;
        auVar15 = vpackssdw_avx(auVar34 ^ auVar22,auVar34 ^ auVar22);
        auVar13 = vpermq_avx2(ZEXT1632(auVar15),0x55);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x1a] = cVar7 + '\n';
        }
        auVar15 = vpackssdw_avx(auVar36._16_16_,auVar36._16_16_);
        auVar15 = vpackssdw_avx(auVar34 ^ auVar15,auVar34 ^ auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar15),0x55);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x1b] = cVar7 + '\v';
        }
        auVar38 = vpor_avx2(auVar38,_DAT_001b8f20);
        auVar15 = vpcmpgtq_avx(auVar38._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpackssdw_avx(auVar15,auVar15);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar12,auVar13);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x1c] = cVar7 + '\f';
        }
        auVar15 = vpcmpgtq_avx(auVar38._0_16_ ^ auVar32,auVar32 ^ auVar10);
        auVar15 = vpshufhw_avx(auVar15,0x84);
        auVar13 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar15),0x55);
        auVar13 = vpackssdw_avx2(auVar12,auVar13);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x1d] = cVar7 + '\r';
        }
        auVar38 = vpcmpgtq_avx2(auVar38 ^ auVar35,auVar39);
        auVar13 = vpackssdw_avx2(auVar12,auVar38);
        auVar13 = vpackssdw_avx2(auVar12,auVar37 ^ auVar13);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x1e] = cVar7 + '\x0e';
        }
        auVar13 = vpshufhw_avx2(auVar38,0x84);
        auVar13 = vpackssdw_avx2(auVar12,auVar37 ^ auVar13);
        auVar13 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar13._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_d8.mem_[uVar9 + 0x1f] = cVar7 + '\x0f';
        }
        uVar9 = uVar9 + 0x20;
      } while ((local_d8.size_ + 0x1f & 0xffffffffffffffe0) != uVar9);
    }
    if (local_e8.size_ != 0) {
      lVar8 = local_e8.size_ - 1;
      auVar11._8_8_ = lVar8;
      auVar11._0_8_ = lVar8;
      auVar13._16_8_ = lVar8;
      auVar13._0_16_ = auVar11;
      auVar13._24_8_ = lVar8;
      uVar9 = 0;
      auVar14 = vpmovsxbq_avx2(ZEXT416(0x17161514));
      auVar31 = vpmovsxbq_avx2(ZEXT416(0x13121110));
      auVar1 = vpmovsxbq_avx2(ZEXT416(0xf0e0d0c));
      auVar2 = vpmovsxbq_avx2(ZEXT416(0xb0a0908));
      auVar3 = vpmovsxbq_avx2(ZEXT416(0x7060504));
      auVar4 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar33._8_8_ = 0x8000000000000000;
      auVar33._0_8_ = 0x8000000000000000;
      auVar34 = vpcmpeqd_avx(auVar34,auVar34);
      auVar36._8_8_ = 0x8000000000000000;
      auVar36._0_8_ = 0x8000000000000000;
      auVar36._16_8_ = 0x8000000000000000;
      auVar36._24_8_ = 0x8000000000000000;
      auVar37 = vpcmpeqd_avx2(auVar37,auVar37);
      do {
        auVar39._8_8_ = uVar9;
        auVar39._0_8_ = uVar9;
        auVar39._16_8_ = uVar9;
        auVar39._24_8_ = uVar9;
        auVar12 = vpor_avx2(auVar39,auVar4);
        auVar10 = vpcmpgtq_avx(auVar12._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        cVar7 = (char)uVar9;
        if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9] = cVar7 + -10;
        }
        auVar10 = vpcmpgtq_avx(auVar12._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 1] = cVar7 + -9;
        }
        auVar38 = auVar36 ^ auVar13;
        auVar12 = vpcmpgtq_avx2(auVar12 ^ auVar36,auVar38);
        auVar35 = vpshuflw_avx2(auVar12,0xe8);
        auVar23._0_4_ = auVar35._16_4_;
        auVar23._4_4_ = auVar23._0_4_;
        auVar23._8_4_ = auVar23._0_4_;
        auVar23._12_4_ = auVar23._0_4_;
        auVar10 = vpackssdw_avx(auVar34 ^ auVar23,auVar34 ^ auVar23);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 2] = cVar7 + -8;
        }
        auVar10 = vpackssdw_avx(auVar12._16_16_,auVar12._16_16_);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 3] = cVar7 + -7;
        }
        auVar35 = vpor_avx2(auVar39,auVar3);
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar12,auVar13);
        auVar24._0_2_ = auVar12._16_2_;
        auVar24._2_2_ = auVar24._0_2_;
        auVar24._4_2_ = auVar24._0_2_;
        auVar24._6_2_ = auVar24._0_2_;
        auVar24._8_2_ = auVar24._0_2_;
        auVar24._10_2_ = auVar24._0_2_;
        auVar24._12_2_ = auVar24._0_2_;
        auVar24._14_2_ = auVar24._0_2_;
        auVar10 = vpacksswb_avx(auVar24,auVar24);
        if ((auVar10 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 4] = cVar7 + -6;
        }
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpshufhw_avx(auVar10,0x84);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar12,auVar13);
        auVar25._0_4_ = auVar12._16_4_;
        auVar25._4_4_ = auVar25._0_4_;
        auVar25._8_4_ = auVar25._0_4_;
        auVar25._12_4_ = auVar25._0_4_;
        auVar10 = vpacksswb_avx(auVar25,auVar25);
        if ((auVar10 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 5] = cVar7 + -5;
        }
        auVar35 = vpcmpgtq_avx2(auVar35 ^ auVar36,auVar38);
        auVar12 = vpackssdw_avx2(auVar13,auVar35);
        auVar10 = auVar34 ^ auVar12._16_16_;
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 6] = cVar7 + -4;
        }
        auVar12 = vpshufhw_avx2(auVar35,0x84);
        auVar10 = auVar34 ^ auVar12._16_16_;
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 7] = cVar7 + -3;
        }
        auVar35 = vpor_avx2(auVar39,auVar2);
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar12 = vpmovzxwd_avx2(auVar10);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_e8.mem_[uVar9 + 8] = cVar7 + -2;
        }
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar10),0x55);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 9] = cVar7 + -1;
        }
        auVar35 = vpcmpgtq_avx2(auVar35 ^ auVar36,auVar38);
        auVar12 = vpshuflw_avx2(auVar35,0xe8);
        auVar26._0_4_ = auVar12._16_4_;
        auVar26._4_4_ = auVar26._0_4_;
        auVar26._8_4_ = auVar26._0_4_;
        auVar26._12_4_ = auVar26._0_4_;
        auVar10 = vpackssdw_avx(auVar34 ^ auVar26,auVar34 ^ auVar26);
        auVar12 = vpermq_avx2(ZEXT1632(auVar10),0x55);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 10] = cVar7;
        }
        auVar10 = vpackssdw_avx(auVar35._16_16_,auVar35._16_16_);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar10),0x55);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0xb] = cVar7 + '\x01';
        }
        auVar35 = vpor_avx2(auVar39,auVar1);
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar13,auVar12);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0xc] = cVar7 + '\x02';
        }
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpshufhw_avx(auVar10,0x84);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar13,auVar12);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0xd] = cVar7 + '\x03';
        }
        auVar35 = vpcmpgtq_avx2(auVar35 ^ auVar36,auVar38);
        auVar12 = vpackssdw_avx2(auVar13,auVar35);
        auVar12 = vpackssdw_avx2(auVar13,auVar37 ^ auVar12);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0xe] = cVar7 + '\x04';
        }
        auVar12 = vpshufhw_avx2(auVar35,0x84);
        auVar12 = vpackssdw_avx2(auVar13,auVar37 ^ auVar12);
        auVar12 = vpacksswb_avx2(auVar12,auVar13);
        if ((auVar12._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0xf] = cVar7 + '\x05';
        }
        auVar12 = vpor_avx2(auVar39,auVar31);
        auVar10 = vpcmpgtq_avx(auVar12._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x10] = cVar7 + '\x06';
        }
        auVar10 = vpcmpgtq_avx(auVar12._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x11] = cVar7 + '\a';
        }
        auVar12 = vpcmpgtq_avx2(auVar12 ^ auVar36,auVar38);
        auVar35 = vpshuflw_avx2(auVar12,0xe8);
        auVar27._0_4_ = auVar35._16_4_;
        auVar27._4_4_ = auVar27._0_4_;
        auVar27._8_4_ = auVar27._0_4_;
        auVar27._12_4_ = auVar27._0_4_;
        auVar10 = vpackssdw_avx(auVar34 ^ auVar27,auVar34 ^ auVar27);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x12] = cVar7 + '\b';
        }
        auVar10 = vpackssdw_avx(auVar12._16_16_,auVar12._16_16_);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x13] = cVar7 + '\t';
        }
        auVar35 = vpor_avx2(auVar39,auVar14);
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar12,auVar13);
        auVar28._0_2_ = auVar12._16_2_;
        auVar28._2_2_ = auVar28._0_2_;
        auVar28._4_2_ = auVar28._0_2_;
        auVar28._6_2_ = auVar28._0_2_;
        auVar28._8_2_ = auVar28._0_2_;
        auVar28._10_2_ = auVar28._0_2_;
        auVar28._12_2_ = auVar28._0_2_;
        auVar28._14_2_ = auVar28._0_2_;
        auVar10 = vpacksswb_avx(auVar28,auVar28);
        if ((auVar10 >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x14] = cVar7 + '\n';
        }
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpshufhw_avx(auVar10,0x84);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar12,auVar13);
        auVar29._0_4_ = auVar12._16_4_;
        auVar29._4_4_ = auVar29._0_4_;
        auVar29._8_4_ = auVar29._0_4_;
        auVar29._12_4_ = auVar29._0_4_;
        auVar10 = vpacksswb_avx(auVar29,auVar29);
        if ((auVar10 >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x15] = cVar7 + '\v';
        }
        auVar35 = vpcmpgtq_avx2(auVar35 ^ auVar36,auVar38);
        auVar12 = vpackssdw_avx2(auVar13,auVar35);
        auVar10 = auVar34 ^ auVar12._16_16_;
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x16] = cVar7 + '\f';
        }
        auVar12 = vpshufhw_avx2(auVar35,0x84);
        auVar10 = auVar34 ^ auVar12._16_16_;
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpacksswb_avx(auVar10,auVar10);
        if ((auVar10 >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x17] = cVar7 + '\r';
        }
        auVar35 = vpor_avx2(auVar39,_DAT_001b8f40);
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar12 = vpmovzxwd_avx2(auVar10);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12 & (undefined1  [32])0x1) != (undefined1  [32])0x0) {
          local_e8.mem_[uVar9 + 0x18] = cVar7 + '\x0e';
        }
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar10),0x55);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12._16_16_ >> 8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x19] = cVar7 + '\x0f';
        }
        auVar35 = vpcmpgtq_avx2(auVar35 ^ auVar36,auVar38);
        auVar12 = vpshuflw_avx2(auVar35,0xe8);
        auVar30._0_4_ = auVar12._16_4_;
        auVar30._4_4_ = auVar30._0_4_;
        auVar30._8_4_ = auVar30._0_4_;
        auVar30._12_4_ = auVar30._0_4_;
        auVar10 = vpackssdw_avx(auVar34 ^ auVar30,auVar34 ^ auVar30);
        auVar12 = vpermq_avx2(ZEXT1632(auVar10),0x55);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12._16_16_ >> 0x10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x1a] = cVar7 + '\x10';
        }
        auVar10 = vpackssdw_avx(auVar35._16_16_,auVar35._16_16_);
        auVar10 = vpackssdw_avx(auVar34 ^ auVar10,auVar34 ^ auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar10),0x55);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12._16_16_ >> 0x18 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x1b] = cVar7 + '\x11';
        }
        auVar35 = vpor_avx2(auVar39,_DAT_001b8f20);
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpackssdw_avx(auVar10,auVar10);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar13,auVar12);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12._16_16_ >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x1c] = cVar7 + '\x12';
        }
        auVar10 = vpcmpgtq_avx(auVar35._0_16_ ^ auVar33,auVar33 ^ auVar11);
        auVar10 = vpshufhw_avx(auVar10,0x84);
        auVar12 = vpermq_avx2(ZEXT1632(auVar34 ^ auVar10),0x55);
        auVar12 = vpackssdw_avx2(auVar13,auVar12);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12._16_16_ >> 0x28 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x1d] = cVar7 + '\x13';
        }
        auVar35 = vpcmpgtq_avx2(auVar35 ^ auVar36,auVar38);
        auVar12 = vpackssdw_avx2(auVar13,auVar35);
        auVar12 = vpackssdw_avx2(auVar13,auVar37 ^ auVar12);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12._16_16_ >> 0x30 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x1e] = cVar7 + '\x14';
        }
        auVar12 = vpshufhw_avx2(auVar35,0x84);
        auVar12 = vpackssdw_avx2(auVar13,auVar37 ^ auVar12);
        auVar12 = vpacksswb_avx2(auVar13,auVar12);
        if ((auVar12._16_16_ >> 0x38 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_e8.mem_[uVar9 + 0x1f] = cVar7 + '\x15';
        }
        uVar9 = uVar9 + 0x20;
      } while ((local_e8.size_ + 0x1f & 0xffffffffffffffe0) != uVar9);
    }
    auVar37 = vpmullw_avx2(*(undefined1 (*) [32])local_e8.mem_,*(undefined1 (*) [32])local_d8.mem_);
    auVar14 = vpsrlw_avx2(*(undefined1 (*) [32])local_d8.mem_,8);
    auVar31 = vpsrlw_avx2(*(undefined1 (*) [32])local_e8.mem_,8);
    auVar14 = vpmullw_avx2(auVar31,auVar14);
    auVar14 = vpsllw_avx2(auVar14,8);
    auVar37 = vpand_avx2(auVar37,_DAT_001ba380);
    auVar37 = vpor_avx2(auVar37,auVar14);
    *(undefined1 (*) [32])local_f8.mem_ = auVar37;
    if (local_f8.size_ != 0) {
      uVar9 = 0;
      do {
        local_b8._vptr_ITransientExpression = (_func_int **)0x1b3b11;
        local_b8.m_isBinaryExpression = true;
        local_b8.m_result = false;
        local_b8._10_6_ = 0;
        local_c8.file =
             "/workspace/llm4binary/github/license_c_cmakelists/kpu[P]intgemm/test/kernels/multiply_test.cc"
        ;
        local_c8.line = 0x1b;
        Catch::StringRef::StringRef(&local_88,"output[i] == Type_(input1[i] * input2[i])");
        Catch::AssertionHandler::AssertionHandler
                  (&local_78,(StringRef *)&local_b8,&local_c8,local_88,ContinueOnFailure);
        cVar6 = local_e8.mem_[uVar9] * local_d8.mem_[uVar9];
        cVar7 = local_f8.mem_[uVar9];
        puVar5 = local_f8.mem_;
        local_f9 = cVar6;
        Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
        local_b8.m_result = cVar7 == cVar6;
        local_b8.m_isBinaryExpression = true;
        local_b8._vptr_ITransientExpression =
             (_func_int **)&PTR_streamReconstructedExpression_001ed9d8;
        local_a0 = local_c8.file;
        sStack_98 = local_c8.line;
        local_90 = &local_f9;
        local_a8 = puVar5 + uVar9;
        Catch::AssertionHandler::handleExpr(&local_78,&local_b8);
        Catch::ITransientExpression::~ITransientExpression(&local_b8);
        Catch::AssertionHandler::complete(&local_78);
        if (local_78.m_completed == false) {
          (*(local_78.m_resultCapture)->_vptr_IResultCapture[0xe])
                    (local_78.m_resultCapture,&local_78);
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < local_f8.size_);
    }
    free(local_f8.mem_);
    free(local_e8.mem_);
    free(local_d8.mem_);
  }
  return;
}

Assistant:

void kernel_multiply_test() {
  if (kCPU < CPUType_)
    return;

  using vec_t = vector_t<CPUType_, Type_>;
  constexpr int VECTOR_LENGTH = sizeof(vec_t) / sizeof(Type_);

  AlignedVector<Type_> input1(VECTOR_LENGTH);
  AlignedVector<Type_> input2(VECTOR_LENGTH);
  AlignedVector<Type_> output(VECTOR_LENGTH);

  std::iota(input1.begin(), input1.end(), static_cast<Type_>(-VECTOR_LENGTH / 2));
  std::iota(input2.begin(), input2.end(), static_cast<Type_>(-VECTOR_LENGTH / 3));

  *output.template as<vec_t>() = kernels::multiply<Type_>(*input1.template as<vec_t>(), *input2.template as<vec_t>());
  for (std::size_t i = 0; i < output.size(); ++i)
    CHECK(output[i] == Type_(input1[i] * input2[i]));
}